

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 * resample_row_hv_2(uint8 *out,uint8 *in_near,uint8 *in_far,int w,int hs)

{
  uint8 uVar1;
  int iVar2;
  int local_3c;
  int t1;
  int t0;
  int i;
  int hs_local;
  int w_local;
  uint8 *in_far_local;
  uint8 *in_near_local;
  uint8 *out_local;
  
  if (w == 1) {
    uVar1 = (uint8)((int)((uint)*in_near * 3 + (uint)*in_far + 2) >> 2);
    out[1] = uVar1;
    *out = uVar1;
  }
  else {
    local_3c = (uint)*in_near * 3 + (uint)*in_far;
    *out = (uint8)(local_3c + 2 >> 2);
    for (t1 = 1; t1 < w; t1 = t1 + 1) {
      iVar2 = (uint)in_near[t1] * 3 + (uint)in_far[t1];
      out[t1 * 2 + -1] = (uint8)(local_3c * 3 + iVar2 + 8 >> 4);
      out[t1 << 1] = (uint8)(iVar2 * 3 + local_3c + 8 >> 4);
      local_3c = iVar2;
    }
    out[w * 2 + -1] = (uint8)(local_3c + 2 >> 2);
  }
  return out;
}

Assistant:

static uint8 *resample_row_hv_2(uint8 *out, uint8 *in_near, uint8 *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i,t0,t1;
   if (w == 1) {
      out[0] = out[1] = div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   out[0] = div4(t1+2);
   for (i=1; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = div16(3*t0 + t1 + 8);
      out[i*2  ] = div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = div4(t1+2);
   return out;
}